

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool32x4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  bool arg4;
  bool arg3;
  bool arg2;
  bool arg1;
  OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I1);
  iVar2 = GetRegRawInt<unsigned_short>(this,playout->I2);
  iVar3 = GetRegRawInt<unsigned_short>(this,playout->I3);
  iVar4 = GetRegRawInt<unsigned_short>(this,playout->I4);
  bValue = SIMDBool32x4Operation::OpBool32x4
                     (iVar1 != 0,iVar2 != 0,iVar3 != 0,(bool)(-(iVar4 != 0) & 1));
  SetRegRawSimd<unsigned_short>(this,playout->B4_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool32x4(const unaligned T* playout)
    {
        bool arg1 = GetRegRawInt(playout->I1) ? true : false;
        bool arg2 = GetRegRawInt(playout->I2) ? true : false;
        bool arg3 = GetRegRawInt(playout->I3) ? true : false;
        bool arg4 = GetRegRawInt(playout->I4) ? true : false;
        AsmJsSIMDValue result = SIMDBool32x4Operation::OpBool32x4(arg1, arg2, arg3, arg4);
        SetRegRawSimd(playout->B4_0, result);

    }